

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assignPWproduct4setup<double,double>
          (SSVectorBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y)

{
  SSVectorBase<double> *this_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  const_reference pvVar4;
  reference pvVar5;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  int extraout_EDX;
  int __c_01;
  int __c_02;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int __c_03;
  int extraout_EDX_04;
  undefined4 in_register_00000014;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  double dVar6;
  int yj;
  int xi;
  int m;
  int n;
  int j;
  int i;
  SSVectorBase<double> *in_stack_ffffffffffffffa0;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  int local_30;
  int local_2c;
  uint local_20;
  uint local_1c;
  
  this_00 = (SSVectorBase<double> *)CONCAT44(in_register_00000014,in_EDX);
  clear(in_stack_ffffffffffffffa0);
  in_RDI->setupStatus = false;
  local_1c = 0;
  local_20 = 0;
  iVar1 = size((SSVectorBase<double> *)0x2a02a5);
  iVar1 = iVar1 + -1;
  iVar2 = size((SSVectorBase<double> *)0x2a02b6);
  iVar2 = iVar2 + -1;
  if ((-1 < iVar2) && (-1 < iVar1)) {
    pcVar3 = index(in_RSI,(char *)0x0,__c);
    local_2c = (int)pcVar3;
    pcVar3 = index(this_00,(char *)0x0,__c_00);
    local_30 = (int)pcVar3;
    __c_03 = extraout_EDX;
    while ((int)local_1c < iVar1 && (int)local_20 < iVar2) {
      if (local_2c == local_30) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RSI->super_VectorBase<double>).val,(long)local_2c);
        in_stack_ffffffffffffffb0 = (SSVectorBase<double> *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(this_00->super_VectorBase<double>).val,(long)local_2c);
        dVar6 = (double)in_stack_ffffffffffffffb0 * *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)local_2c);
        *pvVar5 = dVar6;
        local_1c = local_1c + 1;
        pcVar3 = index(in_RSI,(char *)(ulong)local_1c,__c_01);
        local_2c = (int)pcVar3;
        local_20 = local_20 + 1;
        pcVar3 = index(this_00,(char *)(ulong)local_20,__c_02);
        local_30 = (int)pcVar3;
        __c_03 = extraout_EDX_00;
      }
      else if (local_2c < local_30) {
        local_1c = local_1c + 1;
        pcVar3 = index(in_RSI,(char *)(ulong)local_1c,__c_03);
        local_2c = (int)pcVar3;
        __c_03 = extraout_EDX_01;
      }
      else {
        local_20 = local_20 + 1;
        pcVar3 = index(this_00,(char *)(ulong)local_20,__c_03);
        local_30 = (int)pcVar3;
        __c_03 = extraout_EDX_02;
      }
    }
    while ((int)local_1c < iVar1 && local_2c != local_30) {
      local_1c = local_1c + 1;
      pcVar3 = index(in_RSI,(char *)(ulong)local_1c,__c_03);
      __c_03 = extraout_EDX_03;
      local_2c = (int)pcVar3;
    }
    while ((int)local_20 < iVar2 && local_2c != local_30) {
      local_20 = local_20 + 1;
      pcVar3 = index(this_00,(char *)(ulong)local_20,__c_03);
      __c_03 = extraout_EDX_04;
      local_30 = (int)pcVar3;
    }
    if (local_2c == local_30) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RSI->super_VectorBase<double>).val,(long)local_2c);
      dVar6 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this_00->super_VectorBase<double>).val,(long)local_2c);
      dVar6 = dVar6 * *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,(long)local_2c);
      *pvVar5 = dVar6;
    }
  }
  setup(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}